

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O2

void __thiscall
TasGrid::GridFourier::getInterpolationWeights(GridFourier *this,double *x,double *weights)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  complex<double> *__z;
  size_t sVar5;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int j;
  long lVar14;
  int i;
  long lVar15;
  size_type __n;
  long lVar16;
  long lVar17;
  int j_1;
  int iVar18;
  ulong uVar19;
  MultiIndexSet *this_00;
  long lVar20;
  int iVar21;
  long lVar22;
  pointer pvVar23;
  undefined8 extraout_XMM0_Qa;
  double dVar24;
  double dVar25;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double local_138;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  numerator_cache;
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  expcache;
  long local_d0;
  vector<int,_std::allocator<int>_> num_oned_points;
  undefined1 local_80 [16];
  vector<int,_std::allocator<int>_> p;
  double local_58;
  double local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  index_map;
  
  this_00 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &(this->super_BaseCanonicalGrid).needed;
  }
  generateIndexingMap(&index_map,this);
  expcache.
  super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__fill_n_a<double*,int,double>(weights,this_00->cache_num_indexes);
  iVar10 = MultiIndexSet::getMaxIndex(&this->active_tensors);
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&expcache,(long)(iVar10 + 1),(allocator_type *)&numerator_cache);
  for (lVar20 = 0; lVar20 <= iVar10; lVar20 = lVar20 + 1) {
    iVar2 = (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar20];
    ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (expcache.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar20,(long)iVar2);
    pcVar4 = expcache.
             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar20].
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pcVar4->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar4->_M_value + 8) = 0;
    pvVar23 = (pointer)cos(-6.283185307179586 / (double)iVar2);
    numerator_cache.
    super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)sin(-6.283185307179586 / (double)iVar2);
    lVar22 = 0;
    numerator_cache.
    super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pvVar23;
    for (lVar14 = 1; lVar14 < iVar2; lVar14 = lVar14 + 1) {
      ::std::operator*((complex<double> *)
                       ((expcache.
                         super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar22),
                       (complex<double> *)&numerator_cache);
      pcVar4 = expcache.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pcVar4[1]._M_value + lVar22) = extraout_XMM0_Qa;
      *(pointer *)(pcVar4[1]._M_value + lVar22 + 8) = pvVar23;
      lVar22 = lVar22 + 0x10;
    }
  }
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::vector(&numerator_cache,(long)(this->super_BaseCanonicalGrid).num_dimensions,
           (allocator_type *)&num_oned_points);
  for (lVar20 = 0; lVar20 < (this->super_BaseCanonicalGrid).num_dimensions; lVar20 = lVar20 + 1) {
    ::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (numerator_cache.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar20,
               (long)(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20] + 1);
    dVar25 = x[lVar20];
    dVar24 = cos(dVar25 * 6.283185307179586);
    dVar25 = sin(dVar25 * 6.283185307179586);
    pcVar4 = numerator_cache.
             super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar20].
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(double *)pcVar4->_M_value = dVar24;
    *(double *)(pcVar4->_M_value + 8) = dVar25;
    for (lVar14 = 1;
        lVar14 <= (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar20]; lVar14 = lVar14 + 1) {
      pcVar4 = numerator_cache.
               super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20].
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar1 = pcVar4 + lVar14 + -1;
      uVar9 = *(undefined8 *)(pcVar1->_M_value + 8);
      pcVar4 = pcVar4 + lVar14;
      *(undefined8 *)pcVar4->_M_value = *(undefined8 *)pcVar1->_M_value;
      *(undefined8 *)(pcVar4->_M_value + 8) = uVar9;
      for (iVar10 = 0;
          iVar10 < (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14 + -1]; iVar10 = iVar10 + 1) {
        __z = numerator_cache.
              super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar20].
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
        ::std::complex<double>::operator*=(__z + lVar14,__z);
      }
    }
  }
  local_d0 = 0;
  for (lVar20 = 0; lVar20 < (this->active_tensors).cache_num_indexes; lVar20 = lVar20 + 1) {
    sVar5 = (this->active_tensors).num_dimensions;
    piVar6 = (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&num_oned_points,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&p);
    piVar7 = (this->wrapper).num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = sVar5 * local_d0;
    lVar22 = 0;
    iVar10 = 1;
    while( true ) {
      __n = (size_type)(this->super_BaseCanonicalGrid).num_dimensions;
      if ((long)__n <= lVar22) break;
      iVar2 = piVar7[*(int *)((long)piVar6 + lVar22 * 4 + lVar14)];
      num_oned_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar22] = iVar2;
      iVar10 = iVar10 * iVar2;
      lVar22 = lVar22 + 1;
    }
    ::std::vector<int,_std::allocator<int>_>::vector(&p,__n,(allocator_type *)local_80);
    iVar2 = (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar20];
    uVar19 = 0;
    iVar21 = iVar10;
    if (iVar10 < 1) {
      iVar21 = 0;
    }
    while (iVar18 = (int)uVar19, iVar18 != iVar21) {
      uVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
      uVar13 = (ulong)uVar3;
      lVar22 = uVar13 * 4 + lVar14 + -4;
      lVar15 = 0;
      local_138 = 1.0;
      lVar17 = uVar13 * 6;
      while( true ) {
        if ((int)(uVar3 + (int)lVar15) < 1) break;
        iVar11 = num_oned_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13 + lVar15 + -1];
        iVar12 = (int)uVar19 % iVar11;
        uVar8 = (long)((iVar11 + 1) * iVar12) / 2;
        ::std::operator*(*(complex<double> **)
                          ((long)&numerator_cache.
                                  super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4),
                         expcache.
                         super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)piVar6 + lVar15 * 4 + lVar22)].
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar12);
        dVar25 = ABS(1.0 - extraout_XMM0_Qa_00);
        if (1e-12 <= dVar25) {
          lVar16 = (long)*(int *)((long)piVar6 + lVar15 * 4 + lVar22);
          ::std::operator*((complex<double> *)
                           (lVar16 * 0x10 +
                           *(long *)((long)&numerator_cache.
                                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].
                                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4))
                           ,expcache.
                            super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 |
                                        uVar8 & 0xffffffff) % (long)iVar11));
          dVar25 = -dVar25;
          local_80._0_8_ = 1.0 - extraout_XMM0_Qa_01;
          local_80._8_8_ = dVar25;
          ::std::operator*(*(complex<double> **)
                            ((long)&numerator_cache.
                                    super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4),
                           expcache.
                           super__Vector_base<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [*(int *)((long)piVar6 + lVar15 * 4 + lVar22)].
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar12);
          local_50 = -dVar25;
          local_58 = 1.0 - extraout_XMM0_Qa_02;
          ::std::operator/((complex<double> *)local_80,(complex<double> *)&local_58);
          dVar25 = extraout_XMM0_Qa_03 + extraout_XMM0_Qa_03 + -1.0;
        }
        else {
          dVar25 = (double)num_oned_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar13 + lVar15 + -1];
        }
        p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar13 + lVar15 + -1] =
             index_map.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(int *)((long)piVar6 + lVar15 * 4 + lVar22)]
             .super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [iVar12];
        lVar16 = lVar15 + -1;
        local_138 = local_138 * dVar25;
        lVar15 = lVar15 + -1;
        uVar19 = (long)(int)uVar19 /
                 (long)num_oned_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13 + lVar16] & 0xffffffff;
        lVar17 = lVar17 + -6;
      }
      iVar11 = MultiIndexSet::getSlot
                         (this_00,p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      weights[iVar11] = local_138 * ((double)iVar2 / (double)iVar10) + weights[iVar11];
      uVar19 = (ulong)(iVar18 + 1);
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&p.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&num_oned_points.super__Vector_base<int,_std::allocator<int>_>);
    local_d0 = local_d0 + 4;
  }
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&numerator_cache);
  ::std::
  vector<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_std::allocator<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  ::~vector(&expcache);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&index_map);
  return;
}

Assistant:

void GridFourier::getInterpolationWeights(const double x[], double weights[]) const {
    // if Fourier coefficient are c, Data from the target function is f, and values of the basis functions are b
    // then we have c = A * f (where A is both the Fourier transform and the reindexing)
    // and the value of the interpolant is result = <c, b> = <A f, b> = <f, A^* b>, where A^* is conjugate transpose
    // However, we consider only the real values (the complex ones add-up to zero), thus we really need A^T (regular transpose)
    // The Fourier transform is symmetric with respect to regular transpose, which leaves only the indexing
    // Take the basis functions, reindex and reorder to a data strucutre, take FFT, reindex and reorder into the weights
    //
    //
    // This code uses a O(N) algorithm instead of an O(N log N) FFT. On a 1D tensor with N=3^l points, we must compute the
    // Fourier transform of
    //      {x_n} = e^(2 \pi i x * {0,1,2, ..., (N-1)/2, -(N-1)/2, ..., -2, -1}).           (componentwise operations)
    // The FFT is
    //      X[m] = \sum_{j=0}^{N-1} e^{-2 \pi i j m / N} x_n
    //           = ( \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} )
    //                + ( \sum_{j=1}^{(N-1)/2} e^{2 \pi i j m / N} e^{-2 \pi i x j} )
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} e^{-2 \pi i j m / N} e^{2 \pi i x j} ] - 1
    //           = 2 * Re[ \sum_{j=0}^{(N-1)/2} (e^{2 \pi i (x-m/N)})^j ] - 1
    //           = 2 * Re[ \frac{1 - e^{2 \pi i (x-m/N) (N+1)/2}}{1 - e^{2 \pi i (x-m/N)}} ] - 1
    // The cost is mainly driven by evaluating the complex exponentials, so we compute what we can at the beginning and
    // park it in a cache.

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    std::vector<std::vector<int>> index_map = generateIndexingMap();

    std::fill_n(weights, work.getNumIndexes(), 0.0);

    // compute what we need for e^{-2 \pi i m / N}
    int maxl = active_tensors.getMaxIndex() + 1;
    std::vector<std::vector<std::complex<double>>> expcache(maxl);
    for(int i=0; i<maxl; i++){
        int num_oned_points = wrapper.getNumPoints(i);
        expcache[i].resize(num_oned_points);
        expcache[i][0] = std::complex<double>(1.0, 0.0);
        double theta = -2.0 * Maths::pi / ((double) num_oned_points);       // step angle
        std::complex<double> step(std::cos(theta), std::sin(theta));
        for(int j=1; j<num_oned_points; j++) expcache[i][j] = expcache[i][j-1] * step;
    }

    // compute what we need for e^{2 \pi i x (N+1)/2}
    std::vector<std::vector<std::complex<double>>> numerator_cache(num_dimensions);
    for(int k=0; k<num_dimensions; k++){
        numerator_cache[k].resize(max_levels[k]+1);
        double theta = 2.0 * Maths::pi * x[k];
        numerator_cache[k][0] = std::complex<double>(std::cos(theta), std::sin(theta));
        for(int j=1; j<max_levels[k]+1; j++){
            numerator_cache[k][j] = numerator_cache[k][j-1];
            for(int i=0; i<wrapper.getNumPoints(j-1); i++) numerator_cache[k][j] *= numerator_cache[k][0];
        }
    }

    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        const int *levels = active_tensors.getIndex(n);
        int num_tensor_points = 1;
        std::vector<int> num_oned_points(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            num_oned_points[j] = wrapper.getNumPoints(levels[j]);
            num_tensor_points *= num_oned_points[j];
        }
        std::vector<int> p(num_dimensions);

        double tensorw = ((double) active_w[n]) / ((double) num_tensor_points);
        for(int i=0; i<num_tensor_points; i++){
            // We interpret this "i" as running through the spatial indexing; convert to internal
            int t=i;
            double fftprod = 1.0;
            for(int j=num_dimensions-1; j>=0; j--){ // here p is the index of the spacial point in Tasmanian indexing
                int r = t % num_oned_points[j];
                int offset = (r*(num_oned_points[j]+1)/2) % num_oned_points[j];     // in order to fetch reduced form of (N+1)*r/(2*N)

                if (std::abs(1.0 - (numerator_cache[j][0] * expcache[levels[j]][r]).real()) <  Maths::num_tol){
                    // we're evaluating the basis functions at a node; take care of zero-divide
                    fftprod *= num_oned_points[j];
                }else{
                    fftprod *= 2.0 * ( (1.0 - numerator_cache[j][levels[j]] * expcache[levels[j]][offset])
                                / (1.0 - numerator_cache[j][0] * expcache[levels[j]][r]) ).real() - 1.0;
                }

                p[j] = index_map[levels[j]][r];
                t /= num_oned_points[j];
            }
            weights[work.getSlot(p)] += (tensorw * fftprod);
        }
    }
}